

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

void __thiscall
TreePropagator::DFSPink
          (TreePropagator *this,int r,vector<bool,_std::allocator<bool>_> *visited,
          vector<bool,_std::allocator<bool>_> *blue,
          unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *badEdges)

{
  bool bVar1;
  GraphPropagator *this_00;
  reference pvVar2;
  GraphPropagator *pGVar3;
  reference pvVar4;
  vector<bool,_std::allocator<bool>_> *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  value_type *in_RDI;
  vector<bool,_std::allocator<bool>_> *in_R8;
  reference rVar5;
  int other;
  int e0;
  int e1;
  int e;
  uint i;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  reference in_stack_ffffffffffffff70;
  size_type __n;
  vector<bool,_std::allocator<bool>_> *this_01;
  reference in_stack_ffffffffffffff80;
  reference local_60;
  int local_4c;
  int local_48;
  int local_44;
  value_type local_40;
  uint local_3c;
  undefined4 in_stack_fffffffffffffff0;
  
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff80._M_p,
                     in_stack_ffffffffffffff70._M_mask);
  std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffc8,true);
  local_3c = 0;
  do {
    this_00 = (GraphPropagator *)(ulong)local_3c;
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 0x1a),(long)in_ESI);
    pGVar3 = (GraphPropagator *)std::vector<int,_std::allocator<int>_>::size(pvVar2);
    if (pGVar3 <= this_00) {
      return;
    }
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 0x1a),(long)in_ESI);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(ulong)local_3c);
    local_40 = *pvVar4;
    local_44 = GraphPropagator::getEndnode
                         (this_00,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    local_48 = GraphPropagator::getEndnode
                         (this_00,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff5c = local_48;
    if (local_48 == in_ESI) {
      in_stack_ffffffffffffff5c = local_44;
    }
    local_4c = in_stack_ffffffffffffff5c;
    GraphPropagator::getEdgeVar(this_00,in_stack_ffffffffffffff5c);
    bVar1 = BoolView::isFixed((BoolView *)0x1e569b);
    this_01 = (vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff80._M_p;
    if (bVar1) {
      GraphPropagator::getEdgeVar(this_00,in_stack_ffffffffffffff5c);
      bVar1 = BoolView::isFalse((BoolView *)this_00);
      this_01 = (vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff80._M_p;
      if (!bVar1) goto LAB_001e570b;
      local_60 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (this_01,in_stack_ffffffffffffff70._M_mask);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_60);
      __n = in_stack_ffffffffffffff70._M_mask;
      if (!bVar1) goto LAB_001e573b;
      std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::insert
                ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                 in_stack_ffffffffffffff70._M_p,in_RDI);
    }
    else {
LAB_001e570b:
      in_stack_ffffffffffffff80 =
           std::vector<bool,_std::allocator<bool>_>::operator[]
                     (this_01,in_stack_ffffffffffffff70._M_mask);
      bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff80)
      ;
      __n = in_stack_ffffffffffffff70._M_mask;
      if (!bVar1) {
LAB_001e573b:
        in_stack_ffffffffffffff70 =
             std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff80._M_p,__n);
        bVar1 = std::_Bit_reference::operator_cast_to_bool
                          ((_Bit_reference *)&stack0xffffffffffffff70);
        if (!bVar1) {
          DFSPink((TreePropagator *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                  (int)((ulong)in_RDX >> 0x20),in_RCX,in_R8,
                  (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  rVar5._M_mask);
        }
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void TreePropagator::DFSPink(int r, std::vector<bool>& visited, std::vector<bool>& blue,
														 std::unordered_set<edge_id>& badEdges) {
	visited[r] = true;
	for (unsigned int i = 0; i < adj[r].size(); i++) {
		const int e = adj[r][i];
		const int e1 = getEndnode(e, 1);
		const int e0 = getEndnode(e, 0);
		const int other = e0 == r ? e1 : e0;
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			if (blue[other]) {
				badEdges.insert(e);
				continue;
			}
		} else if (blue[other]) {
			continue;
		}
		if (visited[other] == false) {
			DFSPink(other, visited, blue, badEdges);
		}
	}
}